

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall soul::StructuralParser::parseUnary(StructuralParser *this)

{
  bool bVar1;
  int iVar2;
  Expression *pEVar3;
  TokenType __s1;
  UnaryOperator *pUVar4;
  Op type;
  Context context;
  Op local_2c;
  Context local_28;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288241);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2aaada);
    if (!bVar1) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x2aaadb,(TokenType)0x28987b,(TokenType)0x289d55);
      if (!bVar1) {
        pEVar3 = parseFactor(this);
        return pEVar3;
      }
      local_28.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
      if (local_28.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_28.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_28.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_28.location.location.data = (this->super_SOULTokeniser).location.location.data;
      local_28.parentScope = this->currentScope;
      __s1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
             ::skip(&this->super_SOULTokeniser);
      iVar2 = strcmp(__s1.text,"-");
      if (iVar2 == 0) {
        local_2c = negate;
      }
      else {
        iVar2 = strcmp(__s1.text,"!");
        if (iVar2 == 0) {
          local_2c = logicalNot;
        }
        else {
          iVar2 = strcmp(__s1.text,"~");
          local_2c = bitwiseNot;
          if (iVar2 != 0) {
            throwInternalCompilerError("getUnaryOpForToken",0x4ce);
          }
        }
      }
      pEVar3 = parseUnary(this);
      pUVar4 = PoolAllocator::
               allocate<soul::AST::UnaryOperator,soul::AST::Context&,soul::AST::Expression&,soul::UnaryOp::Op&>
                         (&this->allocator->pool,&local_28,pEVar3,&local_2c);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.location.sourceCode.object);
      return &pUVar4->super_Expression;
    }
    bVar1 = false;
  }
  pEVar3 = parsePreIncDec(this,bVar1);
  return pEVar3;
}

Assistant:

AST::Expression& parseUnary()
    {
        if (matchIf (Operator::plusplus))    return parsePreIncDec (true);
        if (matchIf (Operator::minusminus))  return parsePreIncDec (false);

        if (matchesAny (Operator::minus, Operator::logicalNot, Operator::bitwiseNot))
        {
            auto context = getContext();
            auto type = getUnaryOpForToken (skip());
            return allocate<AST::UnaryOperator> (context, parseUnary(), type);
        }

        return parseFactor();
    }